

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_sah_builder.h
# Opt level: O3

optional<unsigned_long> __thiscall
bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::try_split
          (BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *this,BBox *bbox,size_t begin
          ,size_t end)

{
  long *plVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  pointer pBVar5;
  pointer pVVar6;
  unsigned_long uVar7;
  pointer puVar8;
  float fVar9;
  undefined1 auVar10 [16];
  Bins *pBVar11;
  pointer puVar12;
  _Storage<unsigned_long,_true> _Var13;
  unsigned_long *puVar14;
  long lVar15;
  unsigned_long *puVar16;
  undefined8 uVar17;
  undefined8 extraout_RDX;
  long lVar18;
  size_t sVar19;
  unsigned_long __tmp;
  ulong uVar20;
  size_t axis;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM16 [16];
  optional<unsigned_long> oVar41;
  Split best_split;
  PerAxisBins per_axis_bins;
  Split local_370;
  undefined8 local_358;
  float fStack_350;
  undefined4 uStack_34c;
  Config *local_348;
  ulong local_340;
  ulong local_338;
  Bins local_330;
  ulong local_230;
  uint uStack_228;
  ulong uStack_224;
  uint uStack_21c;
  long alStack_218 [29];
  ulong uStack_130;
  uint uStack_128;
  ulong uStack_124;
  uint uStack_11c;
  long alStack_118 [29];
  
  pBVar11 = &local_330;
  lVar15 = 0;
  do {
    lVar18 = 0;
    do {
      local_358 = 0xff7fffffff7fffff;
      fStack_350 = -3.4028235e+38;
      *(undefined4 *)((long)pBVar11->_M_elems[0].bbox.min.values + lVar18 + 8) = 0x7f7fffff;
      *(undefined8 *)((long)pBVar11->_M_elems[0].bbox.min.values + lVar18) = 0x7f7fffff7f7fffff;
      *(undefined8 *)((long)pBVar11->_M_elems[0].bbox.max.values + lVar18) = 0xff7fffffff7fffff;
      *(undefined4 *)((long)pBVar11->_M_elems[0].bbox.max.values + lVar18 + 8) = 0xff7fffff;
      *(undefined8 *)((long)(&pBVar11->_M_elems[0].bbox + 1) + lVar18) = 0;
      lVar18 = lVar18 + 0x20;
    } while (lVar18 != 0x100);
    lVar15 = lVar15 + 0x100;
    pBVar11 = pBVar11 + 1;
  } while (lVar15 != 0x300);
  local_338 = end - begin;
  local_370.bin_id = 0x4100000041000000;
  fVar2 = (bbox->min).values[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(bbox->max).values;
  uVar22 = *(ulong *)(bbox->min).values;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar22;
  fVar9 = (bbox->max).values[2] - fVar2;
  auVar25 = vsubps_avx(auVar25,auVar29);
  if (begin <= end && end - begin != 0) {
    puVar12 = (this->prim_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pBVar5 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).bboxes_._M_ptr;
    pVVar6 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).centers_._M_ptr;
    auVar27._0_4_ = 8.0 / fVar9;
    auVar27._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar29 = vdivps_avx(ZEXT816(0x4100000041000000),auVar25);
    auVar28._0_4_ = auVar29._0_4_ * -(float)uVar22;
    auVar28._4_4_ = auVar29._4_4_ * -(float)(uVar22 >> 0x20);
    auVar28._8_4_ = auVar29._8_4_ * -0.0;
    auVar28._12_4_ = auVar29._12_4_ * -0.0;
    auVar10._12_4_ = 0;
    auVar10._0_12_ = ZEXT812(0);
    in_ZMM6 = ZEXT1264(ZEXT812(0)) << 0x20;
    sVar19 = begin;
    do {
      uVar7 = puVar12[sVar19];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)pVVar6[uVar7].values;
      auVar32 = vfmadd213ps_fma(auVar32,auVar29,auVar28);
      uVar22 = vcvttss2usi_avx512f(auVar32);
      if (6 < uVar22) {
        uVar22 = 7;
      }
      iVar21 = (int)uVar22;
      uVar22 = vcmpps_avx512vl(auVar10 << 0x20,auVar32,1);
      if ((uVar22 & 1) == 0) {
        iVar21 = 0;
      }
      uVar23 = (ulong)(uint)(iVar21 << 5);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)pBVar5[uVar7].min.values;
      auVar33 = vmovshdup_avx(auVar32);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)((long)local_330._M_elems[0].bbox.min.values + uVar23);
      auVar34 = vfmadd132ss_fma(ZEXT416((uint)pVVar6[uVar7].values[2]),
                                ZEXT416((uint)(auVar27._0_4_ * -fVar2)),auVar27);
      auVar32 = vminps_avx(auVar38,auVar37);
      auVar30 = ZEXT416((uint)pBVar5[uVar7].min.values[2]);
      auVar38 = vminss_avx(ZEXT416(*(uint *)((long)local_330._M_elems[0].bbox.min.values +
                                            uVar23 + 8)),auVar30);
      uVar17 = vmovlps_avx(auVar32);
      *(undefined8 *)((long)local_330._M_elems[0].bbox.min.values + uVar23) = uVar17;
      *(int *)((long)local_330._M_elems[0].bbox.min.values + uVar23 + 8) = auVar38._0_4_;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)((long)local_330._M_elems[0].bbox.max.values + uVar23);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)pBVar5[uVar7].max.values;
      uVar3 = *(uint *)((long)local_330._M_elems[0].bbox.max.values + uVar23 + 8);
      auVar32 = vmaxps_avx(auVar40,auVar39);
      fVar4 = pBVar5[uVar7].max.values[2];
      uVar20 = vcvttss2usi_avx512f(auVar33);
      uVar17 = vmovlps_avx(auVar32);
      *(undefined8 *)((long)local_330._M_elems[0].bbox.max.values + uVar23) = uVar17;
      auVar38 = ZEXT416((uint)fVar4);
      auVar32 = vmaxss_avx(ZEXT416(uVar3),auVar38);
      *(int *)((long)local_330._M_elems[0].bbox.max.values + uVar23 + 8) = auVar32._0_4_;
      plVar1 = (long *)((long)(&local_330._M_elems[0].bbox + 1) + uVar23);
      *plVar1 = *plVar1 + 1;
      if (6 < uVar20) {
        uVar20 = 7;
      }
      auVar32 = vmaxss_avx(auVar34,ZEXT816(0) << 0x40);
      iVar21 = 0;
      if ((uVar22 & 2) != 0) {
        iVar21 = (int)uVar20;
      }
      uVar22 = (ulong)(uint)(iVar21 << 5);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)((long)&local_230 + uVar22);
      auVar33 = vminps_avx(auVar33,auVar37);
      auVar34 = vminss_avx(ZEXT416(*(uint *)((long)&uStack_228 + uVar22)),auVar30);
      uVar17 = vmovlps_avx(auVar33);
      *(undefined8 *)((long)&local_230 + uVar22) = uVar17;
      *(int *)((long)&uStack_228 + uVar22) = auVar34._0_4_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)((long)&uStack_224 + uVar22);
      auVar33 = vmaxps_avx(auVar34,auVar39);
      auVar38 = vmaxss_avx(ZEXT416(*(uint *)((long)&uStack_21c + uVar22)),auVar38);
      uVar17 = vmovlps_avx(auVar33);
      *(undefined8 *)((long)&uStack_224 + uVar22) = uVar17;
      *(int *)((long)&uStack_21c + uVar22) = auVar38._0_4_;
      *(long *)((long)alStack_218 + uVar22) = *(long *)((long)alStack_218 + uVar22) + 1;
      uVar22 = vcvttss2usi_avx512f(auVar32);
      if (6 < uVar22) {
        uVar22 = 7;
      }
      uVar7 = puVar12[sVar19];
      uVar22 = (ulong)(uint)((int)uVar22 << 5);
      sVar19 = sVar19 + 1;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)((long)&uStack_130 + uVar22);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)pBVar5[uVar7].min.values;
      auVar32 = vminps_avx(auVar30,auVar35);
      auVar38 = vminss_avx(ZEXT416(*(uint *)((long)&uStack_128 + uVar22)),
                           ZEXT416((uint)pBVar5[uVar7].min.values[2]));
      uVar17 = vmovlps_avx(auVar32);
      *(undefined8 *)((long)&uStack_130 + uVar22) = uVar17;
      *(int *)((long)&uStack_128 + uVar22) = auVar38._0_4_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)((long)&uStack_124 + uVar22);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)pBVar5[uVar7].max.values;
      auVar32 = vmaxps_avx(auVar31,auVar36);
      auVar38 = vmaxss_avx(ZEXT416(*(uint *)((long)alStack_118 + (uVar22 - 4))),
                           ZEXT416((uint)pBVar5[uVar7].max.values[2]));
      uVar17 = vmovlps_avx(auVar32);
      *(undefined8 *)((long)&uStack_124 + uVar22) = uVar17;
      *(int *)((long)alStack_118 + (uVar22 - 4)) = auVar38._0_4_;
      *(long *)((long)alStack_118 + uVar22) = *(long *)((long)alStack_118 + uVar22) + 1;
    } while (end != sVar19);
  }
  auVar29 = vmovshdup_avx(auVar25);
  pBVar11 = &local_330;
  local_348 = (Config *)begin;
  local_370.bin_id = vmovlps_avx(auVar25);
  uVar22 = (ulong)(auVar25._0_4_ < auVar29._0_4_);
  local_370.bin_id = 4;
  local_370.cost = 3.4028235e+38;
  local_370.axis = 2;
  if (fVar9 <= *(float *)((long)&local_370.bin_id + uVar22 * 4)) {
    local_370.axis = uVar22;
  }
  sVar19 = 0;
  local_340 = local_370.axis;
  do {
    find_best_split(this,sVar19,pBVar11,&local_370);
    sVar19 = sVar19 + 1;
    pBVar11 = pBVar11 + 1;
  } while (sVar19 != 3);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(bbox->min).values;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(bbox->max).values;
  _Var13 = (_Storage<unsigned_long,_true>)
           (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
  auVar29 = vsubps_avx(auVar26,auVar24);
  fVar2 = (bbox->max).values[2] - (bbox->min).values[2];
  auVar25 = vmovshdup_avx(auVar29);
  auVar10 = vcvtusi2ss_avx512f(in_XMM16,*(size_t *)(_Var13._M_value + 8) + local_338 >>
                                        ((ulong)*(byte *)_Var13 & 0x3f));
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ * auVar25._0_4_)),ZEXT416((uint)fVar2),
                            ZEXT416((uint)(auVar29._0_4_ + auVar25._0_4_)));
  if (auVar25._0_4_ * (auVar10._0_4_ - *(float *)(_Var13._M_value + 0x10)) <= local_370.cost) {
    if (local_338 <= *(size_t *)(_Var13._M_value + 0x20)) {
      uVar17 = 0;
      goto LAB_0010b1f1;
    }
  }
  else {
    local_358 = vmovlps_avx(auVar29);
    fStack_350 = fVar2;
    puVar8 = (this->prim_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar12 = puVar8 + (long)local_348;
    puVar16 = puVar12;
    if ((Config *)end != local_348) {
      pVVar6 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).centers_.
               _M_ptr;
      auVar25 = vcvtusi2ss_avx512f(in_ZMM6._0_16_,local_370.bin_id);
      auVar25 = vfmadd213ss_fma(auVar25,ZEXT416((uint)(*(float *)((long)&local_358 +
                                                                 local_370.axis * 4) * 0.125)),
                                ZEXT416((uint)(bbox->min).values[local_370.axis]));
      puVar14 = puVar8 + end;
      do {
        while( true ) {
          puVar12 = puVar16;
          uVar7 = *puVar12;
          if (pVVar6[uVar7].values[local_370.axis] < auVar25._0_4_) break;
          do {
            puVar14 = puVar14 + -1;
            puVar16 = puVar12;
            if (puVar14 == puVar12) goto LAB_0010b127;
          } while (auVar25._0_4_ <= pVVar6[*puVar14].values[local_370.axis]);
          *puVar12 = *puVar14;
          puVar16 = puVar12 + 1;
          *puVar14 = uVar7;
          puVar12 = puVar14;
          if (puVar14 == puVar16) goto LAB_0010b127;
        }
        puVar16 = puVar12 + 1;
        puVar12 = puVar14;
      } while (puVar16 != puVar14);
    }
LAB_0010b127:
    uVar17 = CONCAT71((int7)((ulong)puVar16 >> 8),1);
    _Var13._M_value = (long)puVar12 - (long)puVar8 >> 3;
    if ((Config *)_Var13._M_value != local_348 && _Var13._M_value != end) goto LAB_0010b1f1;
  }
  _Var13._M_value = fallback_split(this,local_340,(size_t)local_348,end);
  uVar17 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_0010b1f1:
  oVar41.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar17;
  oVar41.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var13._M_value;
  return (optional<unsigned_long>)
         oVar41.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> try_split(const BBox& bbox, size_t begin, size_t end) override {
        PerAxisBins per_axis_bins;
        fill_bins(per_axis_bins, bbox, begin, end);

        auto largest_axis = bbox.get_diagonal().get_largest_axis();
        auto best_split = Split { BinCount / 2, std::numeric_limits<Scalar>::max(), largest_axis };
        for (size_t axis = 0; axis < Node::dimension; ++axis)
            find_best_split(axis, per_axis_bins[axis], best_split);

        // Make sure that the split is good before proceeding with it
        auto leaf_cost = config_.sah.get_non_split_cost(begin, end, bbox);
        if (best_split.cost >= leaf_cost) {
            if (end - begin <= config_.max_leaf_size)
                return std::nullopt;
            return fallback_split(largest_axis, begin, end);
        }

        auto split_pos = fast_mul_add(
            bbox.get_diagonal()[best_split.axis] / static_cast<Scalar>(BinCount),
            static_cast<Scalar>(best_split.bin_id),
            bbox.min[best_split.axis]);

        size_t index = std::partition(prim_ids_.begin() + begin, prim_ids_.begin() + end,
            [&] (size_t i) { return centers_[i][best_split.axis] < split_pos; }) - prim_ids_.begin();
        if (index == begin || index == end)
            return fallback_split(largest_axis, begin, end);

        return std::make_optional(index);
    }